

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O2

void __thiscall deqp::egl::ApiCase::deinit(ApiCase *this)

{
  pointer puVar1;
  Library *pLVar2;
  
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  (*pLVar2->_vptr_Library[0x34])(pLVar2,this->m_display);
  this->m_display = (EGLDisplay)0x0;
  puVar1 = (this->m_supportedClientAPIs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_supportedClientAPIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_supportedClientAPIs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void ApiCase::deinit (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();
	egl.terminate(m_display);

	m_display = EGL_NO_DISPLAY;
	m_supportedClientAPIs.clear();
}